

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

bool __thiscall leveldb::log::Reader::ReadRecord(Reader *this,Slice *record,string *scratch)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  ulong bytes;
  char *in_RDX;
  Slice *in_RSI;
  long in_RDI;
  char buf [40];
  uint64_t physical_record_offset;
  uint record_type;
  Slice fragment;
  uint64_t prospective_record_offset;
  bool in_fragmented_record;
  string *in_stack_ffffffffffffff18;
  Slice *in_stack_ffffffffffffff20;
  Reader *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff50;
  Reader *pRVar9;
  Reader *this_00;
  char local_88 [8];
  Slice *in_stack_ffffffffffffff80;
  Reader *in_stack_ffffffffffffff88;
  char *local_60;
  size_t local_58;
  Slice local_40;
  long local_30;
  byte local_21;
  char *local_20;
  Slice *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((*(ulong *)(in_RDI + 0x38) < *(ulong *)(in_RDI + 0x48)) &&
     (bVar1 = SkipToInitialBlock(in_stack_ffffffffffffff38), !bVar1)) {
    return false;
  }
  std::__cxx11::string::clear();
  Slice::clear(local_18);
  local_21 = 0;
  local_30 = 0;
  Slice::Slice(&local_40);
LAB_00108f0e:
  uVar2 = ReadPhysicalRecord(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  pRVar9 = *(Reader **)(in_RDI + 0x40);
  sVar3 = Slice::size((Slice *)(in_RDI + 0x20));
  this_00 = pRVar9;
  sVar4 = Slice::size(&local_40);
  lVar8 = (long)pRVar9 + ((-7 - sVar3) - sVar4);
  if ((*(byte *)(in_RDI + 0x50) & 1) != 0) goto code_r0x00108f7d;
  goto LAB_00108fae;
code_r0x00108f7d:
  if (uVar2 != 3) {
    if (uVar2 == 4) {
      *(undefined1 *)(in_RDI + 0x50) = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 0x50) = 0;
LAB_00108fae:
      bytes = (ulong)(uVar2 - 1);
      switch(bytes) {
      case 0:
        if (((local_21 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
          std::__cxx11::string::size();
          ReportCorruption(this_00,bytes,in_stack_ffffffffffffff50);
        }
        local_30 = lVar8;
        std::__cxx11::string::clear();
        local_18->data_ = local_40.data_;
        local_18->size_ = local_40.size_;
        *(long *)(in_RDI + 0x38) = local_30;
        return true;
      case 1:
        if (((local_21 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
          std::__cxx11::string::size();
          ReportCorruption(this_00,bytes,in_stack_ffffffffffffff50);
        }
        pcVar7 = local_20;
        local_30 = lVar8;
        in_stack_ffffffffffffff50 = Slice::data(&local_40);
        Slice::size(&local_40);
        std::__cxx11::string::assign(pcVar7,(ulong)in_stack_ffffffffffffff50);
        local_21 = 1;
        break;
      case 2:
        if ((local_21 & 1) == 0) {
          Slice::size(&local_40);
          ReportCorruption(this_00,bytes,in_stack_ffffffffffffff50);
        }
        else {
          pcVar7 = local_20;
          pcVar6 = Slice::data(&local_40);
          Slice::size(&local_40);
          std::__cxx11::string::append(pcVar7,(ulong)pcVar6);
        }
        break;
      case 3:
        if ((local_21 & 1) != 0) {
          pcVar7 = Slice::data(&local_40);
          Slice::size(&local_40);
          std::__cxx11::string::append(local_20,(ulong)pcVar7);
          Slice::Slice(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          local_18->data_ = local_60;
          local_18->size_ = local_58;
          *(long *)(in_RDI + 0x38) = local_30;
          return true;
        }
        Slice::size(&local_40);
        ReportCorruption(this_00,bytes,in_stack_ffffffffffffff50);
        break;
      case 4:
        if ((local_21 & 1) != 0) {
          std::__cxx11::string::clear();
        }
        return false;
      case 5:
        if ((local_21 & 1) != 0) {
          std::__cxx11::string::size();
          ReportCorruption(this_00,bytes,in_stack_ffffffffffffff50);
          local_21 = 0;
          std::__cxx11::string::clear();
        }
        break;
      default:
        snprintf(local_88,0x28,"unknown record type %u",(ulong)uVar2);
        in_stack_ffffffffffffff20 = (Slice *)Slice::size(&local_40);
        if ((local_21 & 1) == 0) {
          in_stack_ffffffffffffff18 = (string *)0x0;
        }
        else {
          in_stack_ffffffffffffff18 = (string *)std::__cxx11::string::size();
        }
        ReportCorruption(this_00,bytes,in_stack_ffffffffffffff50);
        local_21 = 0;
        std::__cxx11::string::clear();
      }
    }
  }
  goto LAB_00108f0e;
}

Assistant:

bool Reader::ReadRecord(Slice* record, std::string* scratch) {
  if (last_record_offset_ < initial_offset_) {
    if (!SkipToInitialBlock()) {
      return false;
    }
  }

  scratch->clear();
  record->clear();
  bool in_fragmented_record = false;
  // Record offset of the logical record that we're reading
  // 0 is a dummy value to make compilers happy
  uint64_t prospective_record_offset = 0;

  Slice fragment;
  while (true) {
    const unsigned int record_type = ReadPhysicalRecord(&fragment);

    // ReadPhysicalRecord may have only had an empty trailer remaining in its
    // internal buffer. Calculate the offset of the next physical record now
    // that it has returned, properly accounting for its header size.
    uint64_t physical_record_offset =
        end_of_buffer_offset_ - buffer_.size() - kHeaderSize - fragment.size();

    if (resyncing_) {
      if (record_type == kMiddleType) {
        continue;
      } else if (record_type == kLastType) {
        resyncing_ = false;
        continue;
      } else {
        resyncing_ = false;
      }
    }

    switch (record_type) {
      case kFullType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(1)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->clear();
        *record = fragment;
        last_record_offset_ = prospective_record_offset;
        return true;

      case kFirstType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(2)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->assign(fragment.data(), fragment.size());
        in_fragmented_record = true;
        break;

      case kMiddleType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(1)");
        } else {
          scratch->append(fragment.data(), fragment.size());
        }
        break;

      case kLastType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(2)");
        } else {
          scratch->append(fragment.data(), fragment.size());
          *record = Slice(*scratch);
          last_record_offset_ = prospective_record_offset;
          return true;
        }
        break;

      case kEof:
        if (in_fragmented_record) {
          // This can be caused by the writer dying immediately after
          // writing a physical record but before completing the next; don't
          // treat it as a corruption, just ignore the entire logical record.
          scratch->clear();
        }
        return false;

      case kBadRecord:
        if (in_fragmented_record) {
          ReportCorruption(scratch->size(), "error in middle of record");
          in_fragmented_record = false;
          scratch->clear();
        }
        break;

      default: {
        char buf[40];
        snprintf(buf, sizeof(buf), "unknown record type %u", record_type);
        ReportCorruption(
            (fragment.size() + (in_fragmented_record ? scratch->size() : 0)),
            buf);
        in_fragmented_record = false;
        scratch->clear();
        break;
      }
    }
  }
  return false;
}